

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_textedit_move_to_word_previous(nk_text_edit *state)

{
  int iVar1;
  bool bVar2;
  int local_14;
  int c;
  nk_text_edit *state_local;
  
  local_14 = state->cursor;
  do {
    local_14 = local_14 + -1;
    bVar2 = false;
    if (-1 < local_14) {
      iVar1 = nk_is_word_boundary(state,local_14);
      bVar2 = iVar1 == 0;
    }
  } while (bVar2);
  if (local_14 < 0) {
    local_14 = 0;
  }
  return local_14;
}

Assistant:

NK_INTERN int
nk_textedit_move_to_word_previous(struct nk_text_edit *state)
{
   int c = state->cursor - 1;
   while( c >= 0 && !nk_is_word_boundary(state, c))
      --c;

   if( c < 0 )
      c = 0;

   return c;
}